

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::layout_for_member_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t index)

{
  Bitset *pBVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  pBVar1 = Compiler::get_member_decoration_bitset
                     ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index);
  if ((pBVar1->lower & 0x20) == 0) {
    if ((pBVar1->lower & 0x10) == 0) {
      pcVar3 = "";
      paVar2 = &local_b;
    }
    else {
      pcVar3 = "column_major ";
      paVar2 = &local_a;
    }
  }
  else {
    pcVar3 = "row_major ";
    paVar2 = &local_9;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::layout_for_member(const SPIRType &type, uint32_t index)
{
	auto &flags = get_member_decoration_bitset(type.self, index);

	// HLSL can emit row_major or column_major decoration in any struct.
	// Do not try to merge combined decorations for children like in GLSL.

	// Flip the convention. HLSL is a bit odd in that the memory layout is column major ... but the language API is "row-major".
	// The way to deal with this is to multiply everything in inverse order, and reverse the memory layout.
	if (flags.get(DecorationColMajor))
		return "row_major ";
	else if (flags.get(DecorationRowMajor))
		return "column_major ";

	return "";
}